

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

void __thiscall
duckdb::
PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>::
Insert(PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
       *this,hugeint_t value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *ppVar3;
  hugeint_t local_20;
  
  local_20.upper = value.upper;
  local_20.lower = value.lower;
  if ((this->full == false) && (ppVar3 = Lookup(this,&local_20), ppVar3->index == 0xffffffff)) {
    if ((this->size + 1 <= this->maximum_size) &&
       (bVar2 = AddToTarget<duckdb::hugeint_t,_0>(this,&local_20), bVar2)) {
      (ppVar3->value).lower = local_20.lower;
      (ppVar3->value).upper = local_20.upper;
      iVar1 = this->size;
      this->size = iVar1 + 1;
      ppVar3->index = (uint32_t)iVar1;
      return;
    }
    this->full = true;
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}